

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cc
# Opt level: O0

int __thiscall ResultHandler::handle(ResultHandler *this,Observables *observables,Values *results)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  const_reference ppOVar5;
  string local_50 [36];
  int local_2c;
  Values *pVStack_28;
  int i;
  Values *results_local;
  Observables *observables_local;
  ResultHandler *this_local;
  
  pVStack_28 = results;
  results_local = (Values *)observables;
  observables_local = (Observables *)this;
  for (local_2c = 0; uVar1 = (ulong)local_2c,
      sVar2 = std::vector<double,_std::allocator<double>_>::size(pVStack_28), uVar1 < sVar2;
      local_2c = local_2c + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pVStack_28,(long)local_2c);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
    poVar4 = std::operator<<(poVar4," ");
    ppOVar5 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::
              operator[]((vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>
                          *)results_local,(long)local_2c);
    (*(*ppOVar5)->_vptr_Observable[1])();
    poVar4 = std::operator<<(poVar4,local_50);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_50);
  }
  this->m_callcount = this->m_callcount + 1;
  this_local._4_4_ = (uint)(this->m_callcount == this->m_maxcall);
  return this_local._4_4_;
}

Assistant:

int handle(const SSM::Observables& observables,
	     const SSM::Values& results)
  {
    for(int i(0); i<results.size(); i++)
      std::cout << results[i] << " " 
		<< observables[i]->unit() << std::endl;
    
    m_callcount +=1;

    if(m_callcount==m_maxcall)
      return 1;
    
    return 0;
  }